

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O1

long __thiscall BufferIndex<double,_long>::find(BufferIndex<double,_long> *this,double key)

{
  double dVar1;
  leaf_node *plVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  double local_30;
  const_iterator local_28;
  
  if ((key < this->min_key) || (this->max_key < key)) {
    if (this->min_key <= key) {
      sVar3 = (this->right_buffer).number;
      if (sVar3 != 0) {
        sVar5 = 0;
        while (dVar1 = (this->right_buffer).keys[sVar5], dVar1 < key) {
          sVar5 = sVar5 + 1;
          if (sVar3 == sVar5) {
            return 0;
          }
        }
        if ((dVar1 == key) && (!NAN(dVar1) && !NAN(key))) {
          return (this->right_buffer).payloads[sVar5];
        }
      }
    }
    else {
      sVar3 = (this->left_buffer).number;
      if (sVar3 != 0) {
        sVar5 = 0;
        while (dVar1 = (this->left_buffer).keys[sVar5], dVar1 < key) {
          sVar5 = sVar5 + 1;
          if (sVar3 == sVar5) {
            return 0;
          }
        }
        if ((dVar1 == key) && (!NAN(dVar1) && !NAN(key))) {
          return (this->left_buffer).payloads[sVar5];
        }
      }
    }
    return 0;
  }
  local_30 = key;
  stx::
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  ::upper_bound(&local_28,&this->btree,&local_30);
  if (local_28.currslot == 0) {
    plVar2 = (local_28.currnode)->prevleaf;
    if (plVar2 == (leaf_node *)0x0) {
      local_28.currslot = 0;
      goto LAB_001046bb;
    }
    local_28.currslot = (plVar2->super_node).slotuse;
    local_28.currnode = plVar2;
  }
  local_28.currslot = local_28.currslot - 1;
LAB_001046bb:
  local_28.temp_value.first = (local_28.currnode)->slotkey[local_28.currslot];
  local_28.temp_value.second = (local_28.currnode)->slotdata[local_28.currslot];
  lVar4 = BufferNode<double,_long>::find(local_28.temp_value.second,local_30);
  return lVar4;
}

Assistant:

P find(K key) const {
        if (!less_than(key, min_key) && !greater_than(key, max_key)) {
            return (--btree.upper_bound(key))->second->find(key);
        }
        else if (less_than(key, min_key)) {
            return left_buffer.find(key);
        }
        else {
            return right_buffer.find(key);
        }
    }